

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs.c
# Opt level: O1

char * make_tmp_buffer(FFSBuffer buf,int64_t size)

{
  long lVar1;
  void *pvVar2;
  size_t s;
  
  lVar1 = buf->tmp_buffer_size;
  if (lVar1 < 0) {
    if (-lVar1 < size) {
      return (char *)0x0;
    }
  }
  else {
    if (lVar1 == 0) {
      s = 0x400;
      if (0x400 < size) {
        s = size;
      }
      pvVar2 = ffs_malloc(s);
      buf->tmp_buffer = pvVar2;
      buf->tmp_buffer_size = s;
    }
    if (buf->tmp_buffer_size < size) {
      pvVar2 = ffs_realloc(buf->tmp_buffer,size);
      buf->tmp_buffer = pvVar2;
      if (pvVar2 != (void *)0x0) {
        pvVar2 = (void *)size;
      }
      buf->tmp_buffer_size = (ssize_t)pvVar2;
    }
    buf->tmp_buffer_in_use_size = size;
  }
  return (char *)buf->tmp_buffer;
}

Assistant:

extern
char *
make_tmp_buffer(FFSBuffer buf, int64_t size)
{
    if (buf->tmp_buffer_size < 0) {
	/* fixed size buffer */
	if (size > (-buf->tmp_buffer_size)) return NULL;
	return buf->tmp_buffer;
    }
    if (buf->tmp_buffer_size == 0) {
	int64_t tmp_size = Max(size, TMP_BUFFER_INIT_SIZE);
	buf->tmp_buffer = malloc(tmp_size);
	buf->tmp_buffer_size = tmp_size;
    }
    if (size > buf->tmp_buffer_size) {
	buf->tmp_buffer = realloc(buf->tmp_buffer, size);
	if (buf->tmp_buffer) {
	    buf->tmp_buffer_size = size;
	} else {
	    buf->tmp_buffer_size = 0;
	}
    }
    buf->tmp_buffer_in_use_size = size;
    return buf->tmp_buffer;
}